

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void __thiscall ImGuiMenuColumns::CalcNextTotalWidth(ImGuiMenuColumns *this,bool update_offsets)

{
  ImU16 IVar1;
  ushort uVar2;
  ImU16 IVar3;
  int i;
  int iVar4;
  long lVar5;
  bool bVar6;
  
  lVar5 = 0;
  uVar2 = 0;
  bVar6 = false;
  do {
    IVar1 = this->Widths[lVar5];
    IVar3 = this->Spacing;
    if (IVar1 == 0) {
      IVar3 = 0;
    }
    if (!bVar6) {
      IVar3 = 0;
    }
    IVar3 = uVar2 + IVar3;
    if (update_offsets) {
      iVar4 = (int)lVar5;
      if (iVar4 == 3) {
        this->OffsetMark = IVar3;
      }
      else if (iVar4 == 2) {
        this->OffsetShortcut = IVar3;
      }
      else if (iVar4 == 1) {
        this->OffsetLabel = IVar3;
      }
    }
    bVar6 = (bool)(bVar6 | IVar1 != 0);
    uVar2 = IVar3 + IVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  this->NextTotalWidth = (uint)uVar2;
  return;
}

Assistant:

void ImGuiMenuColumns::CalcNextTotalWidth(bool update_offsets)
{
    ImU16 offset = 0;
    bool want_spacing = false;
    for (int i = 0; i < IM_ARRAYSIZE(Widths); i++)
    {
        ImU16 width = Widths[i];
        if (want_spacing && width > 0)
            offset += Spacing;
        want_spacing |= (width > 0);
        if (update_offsets)
        {
            if (i == 1) { OffsetLabel = offset; }
            if (i == 2) { OffsetShortcut = offset; }
            if (i == 3) { OffsetMark = offset; }
        }
        offset += width;
    }
    NextTotalWidth = offset;
}